

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cjpeg.c
# Opt level: O3

int main(int argc,char **argv)

{
  int *piVar1;
  char *filename;
  char *arg;
  int iVar2;
  JDIMENSION JVar3;
  boolean bVar4;
  boolean bVar5;
  FILE *__stream;
  j_compress_ptr __stream_00;
  size_t __size;
  j_compress_ptr pjVar6;
  size_t sVar7;
  cjpeg_source_ptr pcVar8;
  ulong uVar9;
  int iVar10;
  j_compress_ptr pjVar11;
  long extraout_RDX;
  size_t unaff_RBP;
  int iVar12;
  char *filename_00;
  undefined8 uVar13;
  boolean in_R8D;
  FILE *__stream_01;
  char *pcVar14;
  long lVar15;
  long unaff_R14;
  unsigned_long outsize;
  uchar *outbuffer;
  jpeg_compress_struct cinfo;
  cdjpeg_progress_mgr progress;
  jpeg_error_mgr jerr;
  byte bStack_3a1;
  uint uStack_3a0;
  undefined4 uStack_39c;
  int iStack_394;
  boolean bStack_390;
  int iStack_38c;
  char *pcStack_388;
  char *pcStack_380;
  char *pcStack_378;
  char *pcStack_370;
  FILE *pFStack_368;
  ulong uStack_360;
  j_compress_ptr pjStack_358;
  long lStack_350;
  j_compress_ptr pjStack_348;
  code *pcStack_340;
  FILE *local_338;
  undefined8 local_330;
  undefined8 local_328;
  char **local_320;
  jpeg_compress_struct local_318;
  cdjpeg_progress_mgr local_110 [3];
  long local_58;
  char **local_40;
  undefined8 local_38;
  
  local_328 = 0;
  local_330 = 0;
  progname = *argv;
  if ((progname == (char *)0x0) || (*progname == '\0')) {
    progname = "cjpeg";
  }
  __stream = (FILE *)(local_110 + 1);
  pcStack_340 = (code *)0x102661;
  local_318.err = (jpeg_error_mgr *)jpeg_std_error(__stream);
  pcStack_340 = (code *)0x10267b;
  jpeg_CreateCompress(&local_318,0x3e,0x208);
  local_40 = cdjpeg_message_table;
  local_38 = 0x417000003e8;
  local_318.in_color_space = JCS_RGB;
  pcStack_340 = (code *)0x1026aa;
  jpeg_set_defaults(&local_318);
  pcStack_340 = (code *)0x1026ba;
  iVar2 = parse_switches(&local_318,argc,argv,0,in_R8D);
  iVar10 = argc + -1;
  __stream_00 = &local_318;
  if (iVar2 < iVar10) {
LAB_00102a4d:
    pcStack_340 = (code *)0x102a52;
    main_cold_8();
    __size = unaff_RBP;
    pjVar6 = __stream_00;
LAB_00102a52:
    __stream_00 = pjVar6;
    pcStack_340 = (code *)0x102a57;
    main_cold_5();
LAB_00102a57:
    pcStack_340 = (code *)0x102a5f;
    main_cold_3();
  }
  else {
    if (iVar2 < argc) {
      unaff_R14 = (long)iVar2;
      pcStack_340 = (code *)0x1026e0;
      __stream = fopen(argv[unaff_R14],"rb");
      if (__stream == (FILE *)0x0) {
        pcStack_340 = (code *)0x1026f8;
        main_cold_7();
        goto LAB_001026f8;
      }
    }
    else {
LAB_001026f8:
      pcStack_340 = (code *)0x1026fd;
      __stream = (FILE *)read_stdin();
    }
    if (outfilename == (char *)0x0) {
LAB_00102726:
      if (memdst == 0) {
        pcStack_340 = (code *)0x10273e;
        local_338 = (FILE *)write_stdout();
      }
      else {
        local_338 = (FILE *)0x0;
      }
    }
    else {
      pcStack_340 = (code *)0x102718;
      local_338 = fopen(outfilename,"wb");
      if (local_338 == (FILE *)0x0) {
        pcStack_340 = (code *)0x102726;
        main_cold_1();
        goto LAB_00102726;
      }
    }
    local_320 = argv;
    if (icc_filename == (char *)0x0) {
      pjVar6 = (j_compress_ptr)0x0;
      __size = 0;
LAB_001027ed:
      if (report != 0) {
        pcStack_340 = (code *)0x10280b;
        start_progress_monitor((j_common_ptr)&local_318,local_110);
        local_110[0].report = report;
      }
      if (is_targa == '\x01') {
LAB_0010281e:
        pcStack_340 = (code *)0x102828;
        pcVar8 = jinit_read_targa(&local_318);
      }
      else {
        pcStack_340 = (code *)0x10288c;
        iVar2 = getc(__stream);
        if (iVar2 == -1) {
          (local_318.err)->msg_code = 0x2a;
          pcStack_340 = (code *)0x1028a5;
          (*(local_318.err)->error_exit)((j_common_ptr)&local_318);
        }
        pcStack_340 = (code *)0x1028b0;
        iVar10 = ungetc(iVar2,__stream);
        if (iVar10 == -1) {
          (local_318.err)->msg_code = 0x414;
          pcStack_340 = (code *)0x1028c6;
          (*(local_318.err)->error_exit)((j_common_ptr)&local_318);
        }
        if (iVar2 < 0x47) {
          if (iVar2 == 0) goto LAB_0010281e;
          if (iVar2 == 0x42) {
            pcStack_340 = (code *)0x1028f2;
            pcVar8 = jinit_read_bmp(&local_318,1);
            goto LAB_0010282b;
          }
        }
        else {
          if (iVar2 == 0x47) {
            pcStack_340 = (code *)0x102a32;
            pcVar8 = jinit_read_gif(&local_318);
            goto LAB_0010282b;
          }
          if (iVar2 == 0x50) {
            pcStack_340 = (code *)0x102a0a;
            pcVar8 = jinit_read_ppm(&local_318);
            goto LAB_0010282b;
          }
        }
        (local_318.err)->msg_code = 0x415;
        pcStack_340 = (code *)0x102a20;
        (*(local_318.err)->error_exit)((j_common_ptr)&local_318);
        pcVar8 = (cjpeg_source_ptr)0x0;
      }
LAB_0010282b:
      pcVar8->input_file = (FILE *)__stream;
      pcStack_340 = (code *)0x10283d;
      (*pcVar8->start_input)(&local_318,pcVar8);
      pcStack_340 = (code *)0x102845;
      jpeg_default_colorspace(&local_318);
      pcStack_340 = (code *)0x10285a;
      parse_switches(&local_318,argc,local_320,1,in_R8D);
      __stream_01 = local_338;
      if (memdst == 0) {
        pcStack_340 = (code *)0x102908;
        jpeg_stdio_dest(&local_318,local_338);
      }
      else {
        pcStack_340 = (code *)0x10287b;
        jpeg_mem_dest(&local_318,&local_328,&local_330);
        __stream_01 = local_338;
      }
      pcStack_340 = (code *)0x102917;
      jpeg_start_compress(&local_318,1);
      if (pjVar6 != (j_compress_ptr)0x0) {
        pcStack_340 = (code *)0x10292b;
        jpeg_write_icc_profile(&local_318,pjVar6,__size & 0xffffffff);
      }
      if (local_318.next_scanline < local_318.image_height) {
        do {
          pcStack_340 = (code *)0x102947;
          JVar3 = (*pcVar8->get_pixel_rows)(&local_318,pcVar8);
          pcStack_340 = (code *)0x102955;
          jpeg_write_scanlines(&local_318,pcVar8->buffer,JVar3);
        } while (local_318.next_scanline < local_318.image_height);
      }
      pcStack_340 = (code *)0x102971;
      (*pcVar8->finish_input)(&local_318,pcVar8);
      pcStack_340 = (code *)0x102979;
      jpeg_finish_compress(&local_318);
      pcStack_340 = (code *)0x102981;
      jpeg_destroy_compress(&local_318);
      if (__stream != _stdin) {
        pcStack_340 = (code *)0x102995;
        fclose(__stream);
      }
      if ((__stream_01 != (FILE *)0x0) && (__stream_01 != _stdout)) {
        pcStack_340 = (code *)0x1029ae;
        fclose(__stream_01);
      }
      if (report != 0) {
        pcStack_340 = (code *)0x1029c1;
        end_progress_monitor((j_common_ptr)&local_318);
      }
      if (memdst != 0) {
        pcStack_340 = (code *)0x102a46;
        main_cold_6();
      }
      pcStack_340 = (code *)0x1029d2;
      free(pjVar6);
      return (uint)(local_58 != 0) * 2;
    }
    pcStack_340 = (code *)0x102763;
    __stream_00 = (j_compress_ptr)fopen(icc_filename,"rb");
    __size = unaff_RBP;
    pjVar6 = &local_318;
    if (__stream_00 == (j_compress_ptr)0x0) goto LAB_00102a52;
    pcStack_340 = (code *)0x10277e;
    iVar2 = fseek((FILE *)__stream_00,0,2);
    if (iVar2 < 0) {
LAB_00102a48:
      pcStack_340 = (code *)0x102a4d;
      main_cold_4();
      goto LAB_00102a4d;
    }
    pcStack_340 = (code *)0x10278e;
    __size = ftell((FILE *)__stream_00);
    if ((long)__size < 1) goto LAB_00102a48;
    pcStack_340 = (code *)0x1027a6;
    iVar2 = fseek((FILE *)__stream_00,0,0);
    unaff_RBP = __size;
    if (iVar2 < 0) goto LAB_00102a48;
    pcStack_340 = (code *)0x1027b6;
    pjVar6 = (j_compress_ptr)malloc(__size);
    if (pjVar6 == (j_compress_ptr)0x0) goto LAB_00102a57;
    pcStack_340 = (code *)0x1027d5;
    pjVar11 = __stream_00;
    sVar7 = fread(pjVar6,__size,1,(FILE *)__stream_00);
    iVar10 = (int)pjVar11;
    argv = (char **)pjVar6;
    if (sVar7 != 0) {
      pcStack_340 = (code *)0x1027e6;
      fclose((FILE *)__stream_00);
      goto LAB_001027ed;
    }
  }
  pcStack_340 = parse_switches;
  pjVar6 = __stream_00;
  pjVar11 = (j_compress_ptr)argv;
  main_cold_2();
  is_targa = '\0';
  icc_filename = (char *)0x0;
  outfilename = (char *)0x0;
  memdst = 0;
  report = 0;
  pjVar11->err->trace_level = 0;
  iVar2 = 1;
  iVar12 = (int)pjVar6;
  if (iVar12 < 2) {
    return 1;
  }
  pcStack_380 = (char *)0x0;
  pcStack_388 = (char *)0x0;
  pcStack_378 = (char *)0x0;
  filename_00 = (char *)0x0;
  pcStack_370 = (char *)0x0;
  iStack_394 = 0;
  bStack_390 = 0;
  iStack_38c = iVar10;
  pFStack_368 = __stream;
  uStack_360 = (ulong)(uint)argc;
  pjStack_358 = (j_compress_ptr)argv;
  lStack_350 = unaff_R14;
  pjStack_348 = __stream_00;
  pcStack_340 = (code *)__size;
LAB_00102af2:
  pcVar14 = *(char **)(extraout_RDX + (long)iVar2 * 8);
  if (*pcVar14 == '-') {
    pcVar14 = pcVar14 + 1;
    bVar4 = keymatch(pcVar14,"arithmetic",1);
    if (bVar4 == 0) {
      bVar4 = keymatch(pcVar14,"baseline",1);
      if (bVar4 == 0) {
        bVar4 = keymatch(pcVar14,"dct",2);
        if (bVar4 == 0) {
          bVar4 = keymatch(pcVar14,"debug",1);
          if ((bVar4 == 0) && (bVar4 = keymatch(pcVar14,"verbose",1), bVar4 == 0)) {
            bVar4 = keymatch(pcVar14,"version",4);
            if (bVar4 != 0) goto LAB_00103145;
            bVar4 = keymatch(pcVar14,"grayscale",2);
            if ((bVar4 == 0) && (bVar4 = keymatch(pcVar14,"greyscale",2), bVar4 == 0)) {
              bVar4 = keymatch(pcVar14,"rgb",3);
              if (bVar4 == 0) {
                bVar4 = keymatch(pcVar14,"icc",1);
                if (bVar4 == 0) {
                  bVar4 = keymatch(pcVar14,"maxmemory",3);
                  if (bVar4 == 0) {
                    bVar4 = keymatch(pcVar14,"optimize",1);
                    if ((bVar4 == 0) && (bVar4 = keymatch(pcVar14,"optimise",1), bVar4 == 0)) {
                      bVar4 = keymatch(pcVar14,"outfile",4);
                      if (bVar4 == 0) {
                        bVar4 = keymatch(pcVar14,"progressive",1);
                        if (bVar4 != 0) {
                          iStack_394 = 1;
                          goto LAB_00102b64;
                        }
                        bVar4 = keymatch(pcVar14,"memdst",2);
                        if (bVar4 == 0) {
                          bVar4 = keymatch(pcVar14,"quality",1);
                          if (bVar4 == 0) {
                            bVar4 = keymatch(pcVar14,"qslots",2);
                            if (bVar4 == 0) {
                              bVar4 = keymatch(pcVar14,"qtables",2);
                              if (bVar4 == 0) {
                                bVar4 = keymatch(pcVar14,"report",3);
                                if (bVar4 == 0) {
                                  bVar4 = keymatch(pcVar14,"restart",1);
                                  if (bVar4 == 0) {
                                    bVar4 = keymatch(pcVar14,"sample",2);
                                    if (bVar4 == 0) {
                                      bVar4 = keymatch(pcVar14,"scans",4);
                                      if (bVar4 == 0) {
                                        bVar4 = keymatch(pcVar14,"smooth",2);
                                        if (bVar4 == 0) {
                                          bVar4 = keymatch(pcVar14,"targa",1);
                                          if (bVar4 == 0) goto LAB_00103140;
                                          is_targa = '\x01';
                                        }
                                        else {
                                          iVar2 = iVar2 + 1;
                                          if (((iVar12 <= iVar2) ||
                                              (iVar10 = __isoc99_sscanf(*(undefined8 *)
                                                                         (extraout_RDX +
                                                                         (long)iVar2 * 8),"%d",
                                                                        &uStack_3a0), iVar10 != 1))
                                             || (100 < uStack_3a0)) goto LAB_00103140;
                                          pjVar11->smoothing_factor = uStack_3a0;
                                        }
                                      }
                                      else {
                                        iVar2 = iVar2 + 1;
                                        if (iVar12 <= iVar2) goto LAB_00103140;
                                        pcStack_380 = *(char **)(extraout_RDX + (long)iVar2 * 8);
                                      }
                                    }
                                    else {
                                      iVar2 = iVar2 + 1;
                                      if (iVar12 <= iVar2) goto LAB_00103140;
                                      pcStack_388 = *(char **)(extraout_RDX + (long)iVar2 * 8);
                                    }
                                  }
                                  else {
                                    bStack_3a1 = 0x78;
                                    iVar2 = iVar2 + 1;
                                    if (((iVar12 <= iVar2) ||
                                        (iVar10 = __isoc99_sscanf(*(undefined8 *)
                                                                   (extraout_RDX + (long)iVar2 * 8),
                                                                  "%ld%c",&uStack_3a0,&bStack_3a1),
                                        iVar10 < 1)) ||
                                       (uVar9 = CONCAT44(uStack_39c,uStack_3a0), 0xffff < uVar9))
                                    goto LAB_00103140;
                                    if ((bStack_3a1 & 0xdf) == 0x42) {
                                      pjVar11->restart_interval = uStack_3a0;
                                      uVar9 = 0;
                                    }
                                    pjVar11->restart_in_rows = (int)uVar9;
                                  }
                                }
                                else {
                                  report = 1;
                                }
                              }
                              else {
                                iVar2 = iVar2 + 1;
                                if (iVar12 <= iVar2) goto LAB_00103140;
                                filename_00 = *(char **)(extraout_RDX + (long)iVar2 * 8);
                              }
                            }
                            else {
                              iVar2 = iVar2 + 1;
                              if (iVar12 <= iVar2) goto LAB_00103140;
                              pcStack_378 = *(char **)(extraout_RDX + (long)iVar2 * 8);
                            }
                          }
                          else {
                            iVar2 = iVar2 + 1;
                            if (iVar12 <= iVar2) goto LAB_00103140;
                            pcStack_370 = *(char **)(extraout_RDX + (long)iVar2 * 8);
                          }
                        }
                        else {
                          memdst = 1;
                        }
                      }
                      else {
                        iVar2 = iVar2 + 1;
                        if (iVar12 <= iVar2) goto LAB_00103140;
                        outfilename = *(char **)(extraout_RDX + (long)iVar2 * 8);
                      }
                    }
                    else {
                      pjVar11->optimize_coding = 1;
                    }
                  }
                  else {
                    bStack_3a1 = 0x78;
                    iVar2 = iVar2 + 1;
                    if ((iVar12 <= iVar2) ||
                       (iVar10 = __isoc99_sscanf(*(undefined8 *)(extraout_RDX + (long)iVar2 * 8),
                                                 "%ld%c",&uStack_3a0,&bStack_3a1), iVar10 < 1))
                    goto LAB_00103140;
                    lVar15 = CONCAT44(uStack_39c,uStack_3a0) * 1000;
                    if ((bStack_3a1 & 0xdf) != 0x4d) {
                      lVar15 = CONCAT44(uStack_39c,uStack_3a0);
                    }
                    pjVar11->mem->max_memory_to_use = lVar15 * 1000;
                  }
                }
                else {
                  iVar2 = iVar2 + 1;
                  if (iVar12 <= iVar2) goto LAB_00103140;
                  icc_filename = *(char **)(extraout_RDX + (long)iVar2 * 8);
                }
                goto LAB_00102b64;
              }
              uVar13 = 2;
            }
            else {
              uVar13 = 1;
            }
            jpeg_set_colorspace(pjVar11,uVar13);
          }
          else {
            if (parse_switches_printed_version == '\0') {
              parse_switches_cold_1();
            }
            piVar1 = &pjVar11->err->trace_level;
            *piVar1 = *piVar1 + 1;
          }
        }
        else {
          iVar2 = iVar2 + 1;
          if (iVar12 <= iVar2) goto LAB_00103140;
          lVar15 = (long)iVar2;
          bVar4 = keymatch(*(char **)(extraout_RDX + lVar15 * 8),"int",1);
          if (bVar4 == 0) {
            bVar4 = keymatch(*(char **)(extraout_RDX + lVar15 * 8),"fast",2);
            if (bVar4 == 0) {
              bVar4 = keymatch(*(char **)(extraout_RDX + lVar15 * 8),"float",2);
              if (bVar4 == 0) goto LAB_00103140;
              pjVar11->dct_method = JDCT_FLOAT;
            }
            else {
              pjVar11->dct_method = JDCT_IFAST;
            }
          }
          else {
            pjVar11->dct_method = JDCT_ISLOW;
          }
        }
      }
      else {
        bStack_390 = 1;
      }
    }
    else {
      pjVar11->arith_code = 1;
    }
  }
  else {
    if (0 < iVar2) goto LAB_00103092;
    outfilename = (char *)0x0;
  }
LAB_00102b64:
  iVar2 = iVar2 + 1;
  if (iVar12 <= iVar2) {
LAB_00103092:
    bVar4 = bStack_390;
    if (iStack_38c == 0) {
      return iVar2;
    }
    if ((((pcStack_370 == (char *)0x0) ||
         (bVar5 = set_quality_ratings(pjVar11,pcStack_370,bStack_390), bVar5 != 0)) &&
        (((arg = pcStack_378, filename = pcStack_380, pcVar14 = pcStack_388,
          filename_00 == (char *)0x0 ||
          (bVar4 = read_quant_tables(pjVar11,filename_00,bVar4), bVar4 != 0)) &&
         ((arg == (char *)0x0 || (bVar4 = set_quant_slots(pjVar11,arg), bVar4 != 0)))))) &&
       ((pcVar14 == (char *)0x0 || (bVar4 = set_sample_factors(pjVar11,pcVar14), bVar4 != 0)))) {
      if (iStack_394 != 0) {
        jpeg_simple_progression(pjVar11);
      }
      if (filename == (char *)0x0) {
        return iVar2;
      }
      bVar4 = read_scan_script(pjVar11,filename);
      if (bVar4 != 0) {
        return iVar2;
      }
    }
LAB_00103140:
    usage();
LAB_00103145:
    parse_switches_cold_2();
    fprintf(_stderr,"usage: %s [switches] ",progname);
    fwrite("[inputfile]\n",0xc,1,_stderr);
    fwrite("Switches (names may be abbreviated):\n",0x25,1,_stderr);
    fwrite("  -quality N[,...]   Compression quality (0..100; 5-95 is most useful range,\n",0x4d,1,
           _stderr);
    fwrite("                     default is 75)\n",0x24,1,_stderr);
    fwrite("  -grayscale     Create monochrome JPEG file\n",0x2d,1,_stderr);
    fwrite("  -rgb           Create RGB JPEG file\n",0x26,1,_stderr);
    fwrite("  -optimize      Optimize Huffman table (smaller file, but slow compression)\n",0x4d,1,
           _stderr);
    fwrite("  -progressive   Create progressive JPEG file\n",0x2e,1,_stderr);
    fwrite("  -targa         Input file is Targa format (usually not needed)\n",0x41,1,_stderr);
    fwrite("Switches for advanced users:\n",0x1d,1,_stderr);
    fwrite("  -arithmetic    Use arithmetic coding\n",0x27,1,_stderr);
    fprintf(_stderr,"  -dct int       Use accurate integer DCT method%s\n"," (default)");
    fprintf(_stderr,"  -dct fast      Use less accurate integer DCT method [legacy feature]%s\n","")
    ;
    fprintf(_stderr,"  -dct float     Use floating-point DCT method [legacy feature]%s\n","");
    fwrite("  -icc FILE      Embed ICC profile contained in FILE\n",0x35,1,_stderr);
    fwrite("  -restart N     Set restart interval in rows, or in blocks with B\n",0x43,1,_stderr);
    fwrite("  -smooth N      Smooth dithered input (N=1..100 is strength)\n",0x3e,1,_stderr);
    fwrite("  -maxmemory N   Maximum memory to use (in kbytes)\n",0x33,1,_stderr);
    fwrite("  -outfile name  Specify name for output file\n",0x2e,1,_stderr);
    fwrite("  -memdst        Compress to memory instead of file (useful for benchmarking)\n",0x4e,1,
           _stderr);
    fwrite("  -report        Report compression progress\n",0x2d,1,_stderr);
    fwrite("  -verbose  or  -debug   Emit debug output\n",0x2b,1,_stderr);
    fwrite("  -version       Print version information and exit\n",0x34,1,_stderr);
    fwrite("Switches for wizards:\n",0x16,1,_stderr);
    fwrite("  -baseline      Force baseline quantization tables\n",0x34,1,_stderr);
    fwrite("  -qtables FILE  Use quantization tables given in FILE\n",0x37,1,_stderr);
    fwrite("  -qslots N[,...]    Set component quantization tables\n",0x37,1,_stderr);
    fwrite("  -sample HxV[,...]  Set component sampling factors\n",0x34,1,_stderr);
    fwrite("  -scans FILE    Create multi-scan JPEG per script FILE\n",0x38,1,_stderr);
    exit(1);
  }
  goto LAB_00102af2;
}

Assistant:

int
main(int argc, char **argv)
{
  struct jpeg_compress_struct cinfo;
#ifdef CJPEG_FUZZER
  struct my_error_mgr myerr;
  struct jpeg_error_mgr &jerr = myerr.pub;
#else
  struct jpeg_error_mgr jerr;
#endif
  struct cdjpeg_progress_mgr progress;
  int file_index;
  cjpeg_source_ptr src_mgr;
  FILE *input_file = NULL;
  FILE *icc_file;
  JOCTET *icc_profile = NULL;
  long icc_len = 0;
  FILE *output_file = NULL;
  unsigned char *outbuffer = NULL;
  unsigned long outsize = 0;
  JDIMENSION num_scanlines;

  /* On Mac, fetch a command line. */
#ifdef USE_CCOMMAND
  argc = ccommand(&argv);
#endif

  progname = argv[0];
  if (progname == NULL || progname[0] == 0)
    progname = "cjpeg";         /* in case C library doesn't provide it */

  /* Initialize the JPEG compression object with default error handling. */
  cinfo.err = jpeg_std_error(&jerr);
  jpeg_create_compress(&cinfo);
  /* Add some application-specific error messages (from cderror.h) */
  jerr.addon_message_table = cdjpeg_message_table;
  jerr.first_addon_message = JMSG_FIRSTADDONCODE;
  jerr.last_addon_message = JMSG_LASTADDONCODE;

  /* Initialize JPEG parameters.
   * Much of this may be overridden later.
   * In particular, we don't yet know the input file's color space,
   * but we need to provide some value for jpeg_set_defaults() to work.
   */

  cinfo.in_color_space = JCS_RGB; /* arbitrary guess */
  jpeg_set_defaults(&cinfo);

  /* Scan command line to find file names.
   * It is convenient to use just one switch-parsing routine, but the switch
   * values read here are ignored; we will rescan the switches after opening
   * the input file.
   */

  file_index = parse_switches(&cinfo, argc, argv, 0, FALSE);

#ifdef TWO_FILE_COMMANDLINE
  if (!memdst) {
    /* Must have either -outfile switch or explicit output file name */
    if (outfilename == NULL) {
      if (file_index != argc - 2) {
        fprintf(stderr, "%s: must name one input and one output file\n",
                progname);
        usage();
      }
      outfilename = argv[file_index + 1];
    } else {
      if (file_index != argc - 1) {
        fprintf(stderr, "%s: must name one input and one output file\n",
                progname);
        usage();
      }
    }
  }
#else
  /* Unix style: expect zero or one file name */
  if (file_index < argc - 1) {
    fprintf(stderr, "%s: only one input file\n", progname);
    usage();
  }
#endif /* TWO_FILE_COMMANDLINE */

  /* Open the input file. */
  if (file_index < argc) {
    if ((input_file = fopen(argv[file_index], READ_BINARY)) == NULL) {
      fprintf(stderr, "%s: can't open %s\n", progname, argv[file_index]);
      exit(EXIT_FAILURE);
    }
  } else {
    /* default input file is stdin */
    input_file = read_stdin();
  }

  /* Open the output file. */
  if (outfilename != NULL) {
    if ((output_file = fopen(outfilename, WRITE_BINARY)) == NULL) {
      fprintf(stderr, "%s: can't open %s\n", progname, outfilename);
      exit(EXIT_FAILURE);
    }
  } else if (!memdst) {
    /* default output file is stdout */
    output_file = write_stdout();
  }

  if (icc_filename != NULL) {
    if ((icc_file = fopen(icc_filename, READ_BINARY)) == NULL) {
      fprintf(stderr, "%s: can't open %s\n", progname, icc_filename);
      exit(EXIT_FAILURE);
    }
    if (fseek(icc_file, 0, SEEK_END) < 0 ||
        (icc_len = ftell(icc_file)) < 1 ||
        fseek(icc_file, 0, SEEK_SET) < 0) {
      fprintf(stderr, "%s: can't determine size of %s\n", progname,
              icc_filename);
      exit(EXIT_FAILURE);
    }
    if ((icc_profile = (JOCTET *)malloc(icc_len)) == NULL) {
      fprintf(stderr, "%s: can't allocate memory for ICC profile\n", progname);
      fclose(icc_file);
      exit(EXIT_FAILURE);
    }
    if (fread(icc_profile, icc_len, 1, icc_file) < 1) {
      fprintf(stderr, "%s: can't read ICC profile from %s\n", progname,
              icc_filename);
      free(icc_profile);
      fclose(icc_file);
      exit(EXIT_FAILURE);
    }
    fclose(icc_file);
  }

#ifdef CJPEG_FUZZER
  jerr.error_exit = my_error_exit;
  jerr.emit_message = my_emit_message;
  if (setjmp(myerr.setjmp_buffer))
    HANDLE_ERROR()
#endif

  if (report) {
    start_progress_monitor((j_common_ptr)&cinfo, &progress);
    progress.report = report;
  }

  /* Figure out the input file format, and set up to read it. */
  src_mgr = select_file_type(&cinfo, input_file);
  src_mgr->input_file = input_file;
#ifdef CJPEG_FUZZER
  src_mgr->max_pixels = 1048576;
#endif

  /* Read the input file header to obtain file size & colorspace. */
  (*src_mgr->start_input) (&cinfo, src_mgr);

  /* Now that we know input colorspace, fix colorspace-dependent defaults */
  jpeg_default_colorspace(&cinfo);

  /* Adjust default compression parameters by re-parsing the options */
  file_index = parse_switches(&cinfo, argc, argv, 0, TRUE);

  /* Specify data destination for compression */
#if JPEG_LIB_VERSION >= 80 || defined(MEM_SRCDST_SUPPORTED)
  if (memdst)
    jpeg_mem_dest(&cinfo, &outbuffer, &outsize);
  else
#endif
    jpeg_stdio_dest(&cinfo, output_file);

#ifdef CJPEG_FUZZER
  if (setjmp(myerr.setjmp_buffer))
    HANDLE_ERROR()
#endif

  /* Start compressor */
  jpeg_start_compress(&cinfo, TRUE);

  if (icc_profile != NULL)
    jpeg_write_icc_profile(&cinfo, icc_profile, (unsigned int)icc_len);

  /* Process data */
  while (cinfo.next_scanline < cinfo.image_height) {
    num_scanlines = (*src_mgr->get_pixel_rows) (&cinfo, src_mgr);
    (void)jpeg_write_scanlines(&cinfo, src_mgr->buffer, num_scanlines);
  }

  /* Finish compression and release memory */
  (*src_mgr->finish_input) (&cinfo, src_mgr);
  jpeg_finish_compress(&cinfo);
  jpeg_destroy_compress(&cinfo);

  /* Close files, if we opened them */
  if (input_file != stdin)
    fclose(input_file);
  if (output_file != stdout && output_file != NULL)
    fclose(output_file);

  if (report)
    end_progress_monitor((j_common_ptr)&cinfo);

  if (memdst) {
#ifndef CJPEG_FUZZER
    fprintf(stderr, "Compressed size:  %lu bytes\n", outsize);
#endif
    free(outbuffer);
  }

  free(icc_profile);

  /* All done. */
  return (jerr.num_warnings ? EXIT_WARNING : EXIT_SUCCESS);
}